

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O3

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ASDCP_MCAConfigParser *this_00;
  size_t *psVar2;
  char *pcVar3;
  undefined8 uVar4;
  UL *pUVar5;
  char cVar6;
  int iVar7;
  ChannelFormat_t CVar8;
  _List_node_base *p_Var9;
  bool *pbVar10;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  CommandOptions *pCVar14;
  char *pcVar15;
  CommandOptions *this_01;
  int iVar16;
  uint uVar17;
  long lVar18;
  string *psVar19;
  bool bVar20;
  ui32_t length;
  string mca_config_str;
  allocator<char> local_f9;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  string *local_d0;
  CommandOptions *local_c8;
  CommandOptions *local_c0;
  PathList_t *local_b8;
  bool *local_b0;
  byte_t *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  undefined1 local_98 [8];
  char *local_90;
  bool local_88 [16];
  bool *local_78;
  bool *local_70;
  bool *local_68;
  byte_t *local_60;
  byte_t *local_58;
  byte_t *local_50;
  byte_t *local_48;
  byte_t *local_40;
  _Alloc_hider local_38;
  
  this->error_flag = true;
  this->key_flag = false;
  this->asset_id_flag = false;
  this->encrypt_header_flag = true;
  this->write_hmac = true;
  this->verbose_flag = false;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->fb_dump_size = 0;
  this->no_write_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->stereo_image_flag = false;
  this->write_partial_pcm_flag = false;
  this->use_smpte_labels = false;
  this->j2c_pedantic = true;
  this->fb_size = 0x400000;
  this->key_id_flag = false;
  this->channel_fmt = CF_NONE;
  psVar19 = (string *)&this->out_file;
  paVar1 = &(this->out_file).field_2;
  (this->out_file)._M_dataplus._M_p = (pointer)paVar1;
  (this->out_file)._M_string_length = 0;
  (this->out_file).field_2._M_local_buf[0] = '\0';
  this->show_ul_values_flag = false;
  local_b8 = &this->filenames;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_b8;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_b8;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->channel_assignment).super_Identifier<16U>.m_HasValue = false;
  (this->channel_assignment).super_Identifier<16U>.m_Value[0] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[1] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[2] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[3] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[4] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[5] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar5 = &this->channel_assignment;
  (pUVar5->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->channel_assignment).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00115c48;
  (this->picture_coding).super_Identifier<16U>.m_HasValue = false;
  (this->picture_coding).super_Identifier<16U>.m_Value[0] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[1] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[2] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[3] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[4] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[5] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar5 = &this->picture_coding;
  (pUVar5->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->picture_coding).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00115c48;
  (this->transfer_characteristic).super_Identifier<16U>.m_HasValue = false;
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[0] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[1] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[2] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[3] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[4] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[5] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar5 = &this->transfer_characteristic;
  (pUVar5->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00115c48;
  (this->aux_data_coding).super_Identifier<16U>.m_HasValue = false;
  (this->aux_data_coding).super_Identifier<16U>.m_Value[0] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[1] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[2] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[3] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[4] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[5] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar5 = &this->aux_data_coding;
  (pUVar5->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar5->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00115c48;
  this->dolby_atmos_sync_flag = false;
  this->ffoa = 0;
  this->max_channel_count = 10;
  this->max_object_count = 0x76;
  this->use_interop_sound_wtf = false;
  this_00 = &this->mca_config;
  this_01 = (CommandOptions *)this_00;
  ASDCP::MXF::ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(this_00,g_dict);
  local_c0 = (CommandOptions *)&this->mca_language;
  local_a0 = &(this->mca_language).field_2;
  (this->mca_language)._M_dataplus._M_p = (pointer)local_a0;
  (this->mca_language)._M_string_length = 0;
  (this->mca_language).field_2._M_local_buf[0] = '\0';
  this->key_value[0] = '\0';
  this->key_value[1] = '\0';
  this->key_value[2] = '\0';
  this->key_value[3] = '\0';
  this->key_value[4] = '\0';
  this->key_value[5] = '\0';
  this->key_value[6] = '\0';
  this->key_value[7] = '\0';
  this->key_value[8] = '\0';
  this->key_value[9] = '\0';
  this->key_value[10] = '\0';
  this->key_value[0xb] = '\0';
  this->key_value[0xc] = '\0';
  this->key_value[0xd] = '\0';
  this->key_value[0xe] = '\0';
  this->key_value[0xf] = '\0';
  this->key_id_value[0] = '\0';
  this->key_id_value[1] = '\0';
  this->key_id_value[2] = '\0';
  this->key_id_value[3] = '\0';
  this->key_id_value[4] = '\0';
  this->key_id_value[5] = '\0';
  this->key_id_value[6] = '\0';
  this->key_id_value[7] = '\0';
  this->key_id_value[8] = '\0';
  this->key_id_value[9] = '\0';
  this->key_id_value[10] = '\0';
  this->key_id_value[0xb] = '\0';
  this->key_id_value[0xc] = '\0';
  this->key_id_value[0xd] = '\0';
  this->key_id_value[0xe] = '\0';
  this->key_id_value[0xf] = '\0';
  local_98 = (undefined1  [8])local_88;
  local_90 = (char *)0x0;
  local_88[0] = false;
  if (1 < argc) {
    local_68 = &(this->channel_assignment).super_Identifier<16U>.m_HasValue;
    local_70 = &(this->picture_coding).super_Identifier<16U>.m_HasValue;
    local_b0 = &(this->transfer_characteristic).super_Identifier<16U>.m_HasValue;
    local_78 = &(this->aux_data_coding).super_Identifier<16U>.m_HasValue;
    local_38._M_p = (pointer)this->key_value;
    local_40 = this->key_id_value;
    local_a8 = (this->transfer_characteristic).super_Identifier<16U>.m_Value;
    local_48 = (this->picture_coding).super_Identifier<16U>.m_Value;
    local_50 = (this->channel_assignment).super_Identifier<16U>.m_Value;
    local_58 = this->asset_id_value;
    local_60 = (this->aux_data_coding).super_Identifier<16U>.m_Value;
    iVar16 = 1;
    local_d8 = paVar1;
    local_d0 = psVar19;
    local_c8 = (CommandOptions *)this_00;
    do {
      pCVar14 = (CommandOptions *)argv[iVar16];
      this_01 = pCVar14;
      iVar7 = strcmp((char *)pCVar14,"-help");
      if (iVar7 == 0) {
        this->help_flag = true;
      }
      else if (pCVar14->error_flag == true) {
        bVar20 = pCVar14->key_flag;
        uVar17 = (uint)bVar20;
        this_01 = (CommandOptions *)(ulong)uVar17;
        iVar7 = isalpha(uVar17);
        pcVar15 = local_90;
        if ((9 < uVar17 - 0x30 && iVar7 == 0) || (pCVar14->asset_id_flag != false)) {
          pcVar15 = "Unrecognized argument: %s\n";
LAB_0010fbc0:
          fprintf((FILE *)_stderr,pcVar15,pCVar14);
          goto LAB_0010fb78;
        }
        switch(bVar20) {
        case true:
          this->stereo_image_flag = true;
          break;
        default:
          pcVar15 = "Unrecognized option: %s\n";
          goto LAB_0010fbc0;
        case true:
          if (iVar16 + 1 < argc) {
            lVar18 = (long)(iVar16 + 1);
            this_01 = (CommandOptions *)argv[lVar18];
            if (this_01->error_flag != true) {
              iVar7 = Kumu::hex2bin((char *)this_01,local_60,0x10,(uint *)local_f8);
              bVar20 = iVar7 == 0 && local_f8._0_4_ == 0x10;
              pbVar10 = local_78;
LAB_0010f8e5:
              iVar16 = iVar16 + 1;
              *pbVar10 = bVar20;
              if (!bVar20) {
                pCVar14 = (CommandOptions *)argv[lVar18];
                pcVar15 = "Error decoding UL value: %s\n";
                goto LAB_0010fbc0;
              }
              break;
            }
          }
          CommandOptions(this_01);
          goto LAB_0010fb78;
        case true:
          if (iVar16 + 1 < argc) {
            lVar18 = (long)(iVar16 + 1);
            this_01 = (CommandOptions *)argv[lVar18];
            if (this_01->error_flag != true) {
              iVar7 = Kumu::hex2bin((char *)this_01,local_50,0x10,(uint *)local_f8);
              bVar20 = iVar7 == 0 && local_f8._0_4_ == 0x10;
              pbVar10 = local_68;
              goto LAB_0010f8e5;
            }
          }
          CommandOptions(this_01);
          goto LAB_0010fb78;
        case true:
          this->encrypt_header_flag = false;
          break;
        case true:
          this->use_smpte_labels = true;
          break;
        case true:
          this->write_hmac = false;
          break;
        case true:
          if (iVar16 + 1 < argc) {
            lVar18 = (long)(iVar16 + 1);
            this_01 = (CommandOptions *)argv[lVar18];
            if (this_01->error_flag != true) {
              iVar7 = Kumu::hex2bin((char *)this_01,local_48,0x10,(uint *)local_f8);
              bVar20 = iVar7 == 0 && local_f8._0_4_ == 0x10;
              pbVar10 = local_70;
              goto LAB_0010f8e5;
            }
          }
          CommandOptions(this_01);
          goto LAB_0010fb78;
        case true:
          this_01 = (CommandOptions *)g_dict;
          puVar11 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)g_dict);
          *local_b0 = true;
          uVar4 = puVar11[1];
          *(undefined8 *)local_a8 = *puVar11;
          *(undefined8 *)(local_a8 + 8) = uVar4;
          break;
        case true:
          if (iVar16 + 1 < argc) {
            lVar18 = (long)(iVar16 + 1);
            this_01 = (CommandOptions *)argv[lVar18];
            if (this_01->error_flag != true) {
              iVar7 = Kumu::hex2bin((char *)this_01,local_a8,0x10,(uint *)local_f8);
              bVar20 = iVar7 == 0 && local_f8._0_4_ == 0x10;
              pbVar10 = local_b0;
              goto LAB_0010f8e5;
            }
          }
          CommandOptions(this_01);
          goto LAB_0010fb78;
        case true:
          this->version_flag = true;
          break;
        case true:
          this->no_write_flag = true;
          break;
        case true:
          this->j2c_pedantic = false;
          break;
        case true:
          this->asset_id_flag = true;
          iVar16 = iVar16 + 1;
          if ((argc <= iVar16) ||
             (this_01 = (CommandOptions *)argv[iVar16], this_01->error_flag == true)) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          Kumu::hex2bin((char *)this_01,local_58,0x10,(uint *)local_f8);
          uVar13 = local_f8._0_8_ & 0xffffffff;
          if (local_f8._0_4_ != 0x10) {
            pcVar15 = "Unexpected asset ID length: %u, expecting %u characters.\n";
LAB_0010fcbb:
            fprintf((FILE *)_stderr,pcVar15,uVar13,0x10);
            goto LAB_0010fb78;
          }
          break;
        case true:
          iVar16 = iVar16 + 1;
          if ((argc <= iVar16) ||
             (this_01 = (CommandOptions *)argv[iVar16], this_01->error_flag == true)) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          lVar12 = strtol((char *)this_01,(char **)0x0,10);
          lVar18 = -lVar12;
          if (0 < lVar12) {
            lVar18 = lVar12;
          }
          this->fb_size = (ui32_t)lVar18;
          if (this->verbose_flag == true) {
            this_01 = _stderr;
            fprintf((FILE *)_stderr,"Frame Buffer size: %u bytes.\n");
          }
          break;
        case true:
          iVar16 = iVar16 + 1;
          if ((argc <= iVar16) ||
             (this_01 = (CommandOptions *)argv[iVar16], this_01->error_flag == true)) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          lVar12 = strtol((char *)this_01,(char **)0x0,10);
          lVar18 = -lVar12;
          if (0 < lVar12) {
            lVar18 = lVar12;
          }
          this->duration = (ui32_t)lVar18;
          break;
        case true:
          this->encrypt_header_flag = true;
          break;
        case true:
          iVar16 = iVar16 + 1;
          if ((argc <= iVar16) ||
             (this_01 = (CommandOptions *)argv[iVar16], this_01->error_flag == true)) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          lVar12 = strtol((char *)this_01,(char **)0x0,10);
          lVar18 = -lVar12;
          if (0 < lVar12) {
            lVar18 = lVar12;
          }
          this->start_frame = (ui32_t)lVar18;
          break;
        case true:
          iVar16 = iVar16 + 1;
          if ((argc <= iVar16) || (pcVar15 = argv[iVar16], *pcVar15 == '-')) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          pcVar3 = (char *)(this->mca_language)._M_string_length;
          strlen(pcVar15);
          this_01 = local_c0;
          std::__cxx11::string::_M_replace((ulong)local_c0,0,pcVar3,(ulong)pcVar15);
          break;
        case true:
          this->help_flag = true;
          break;
        case true:
          this->key_id_flag = true;
          iVar16 = iVar16 + 1;
          if ((argc <= iVar16) ||
             (this_01 = (CommandOptions *)argv[iVar16], this_01->error_flag == true)) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          Kumu::hex2bin((char *)this_01,local_40,0x10,(uint *)local_f8);
          uVar13 = local_f8._0_8_ & 0xffffffff;
          if (local_f8._0_4_ != 0x10) {
            pcVar15 = "Unexpected key ID length: %u, expecting %u characters.\n";
            goto LAB_0010fcbb;
          }
          break;
        case true:
          this->key_flag = true;
          iVar16 = iVar16 + 1;
          if ((argc <= iVar16) ||
             (this_01 = (CommandOptions *)argv[iVar16], this_01->error_flag == true)) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          Kumu::hex2bin((char *)this_01,(uchar *)local_38._M_p,0x10,(uint *)local_f8);
          uVar13 = local_f8._0_8_ & 0xffffffff;
          if (local_f8._0_4_ != 0x10) {
            pcVar15 = "Unexpected key length: %u, expecting %u characters.\n";
            goto LAB_0010fcbb;
          }
          break;
        case true:
          iVar16 = iVar16 + 1;
          if ((argc <= iVar16) || (*argv[iVar16] == '-')) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_f8,argv[iVar16],&local_f9);
          CVar8 = decode_channel_fmt((string *)local_f8);
          this->channel_fmt = CVar8;
          this_01 = (CommandOptions *)local_f8._0_8_;
          if ((CommandOptions *)local_f8._0_8_ != (CommandOptions *)(local_f8 + 0x10))
          goto LAB_0010f57a;
          break;
        case true:
          iVar16 = iVar16 + 1;
          if (argc <= iVar16) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          pcVar3 = argv[iVar16];
          this_01 = (CommandOptions *)local_98;
          strlen(pcVar3);
          std::__cxx11::string::_M_replace((ulong)this_01,0,pcVar15,(ulong)pcVar3);
          break;
        case true:
          iVar16 = iVar16 + 1;
          if ((argc <= iVar16) ||
             (this_01 = (CommandOptions *)argv[iVar16], this_01->error_flag == true)) {
            CommandOptions(this_01);
            goto LAB_0010fb78;
          }
          lVar12 = strtol((char *)this_01,(char **)0x0,10);
          lVar18 = -lVar12;
          if (0 < lVar12) {
            lVar18 = lVar12;
          }
          this->picture_rate = (ui32_t)lVar18;
          break;
        case true:
          this->dolby_atmos_sync_flag = true;
          break;
        case true:
          this->show_ul_values_flag = true;
          break;
        case true:
          this->verbose_flag = true;
          break;
        case true:
          this->use_interop_sound_wtf = true;
          break;
        case true:
          this->write_partial_pcm_flag = true;
          break;
        case true:
          this->j2c_pedantic = true;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f8,(char *)pCVar14,&local_f9);
        p_Var9 = (_List_node_base *)operator_new(0x30);
        p_Var9[1]._M_next = p_Var9 + 2;
        pCVar14 = (CommandOptions *)(local_f8 + 0x10);
        if ((CommandOptions *)local_f8._0_8_ == pCVar14) {
          p_Var9[2]._M_next = (_List_node_base *)CONCAT71(local_f8._17_7_,local_f8[0x10]);
          p_Var9[2]._M_prev = (_List_node_base *)local_f8._24_8_;
        }
        else {
          p_Var9[1]._M_next = (_List_node_base *)local_f8._0_8_;
          p_Var9[2]._M_next = (_List_node_base *)CONCAT71(local_f8._17_7_,local_f8[0x10]);
        }
        p_Var9[1]._M_prev = (_List_node_base *)local_f8._8_8_;
        local_f8._8_8_ = (_List_node_base *)0x0;
        local_f8[0x10] = '\0';
        local_f8._0_8_ = pCVar14;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        psVar2 = &(this->filenames).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
        this_01 = (CommandOptions *)local_f8._0_8_;
        if ((CommandOptions *)local_f8._0_8_ != pCVar14) {
LAB_0010f57a:
          this_01 = (CommandOptions *)local_f8._0_8_;
          operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
        }
      }
      pCVar14 = local_c8;
      psVar19 = local_d0;
      iVar16 = iVar16 + 1;
    } while (iVar16 < argc);
    if (local_90 != (char *)0x0) {
      if ((this->mca_language)._M_string_length == 0) {
        local_f8._0_8_ = (CommandOptions *)(local_f8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"en-US","");
        cVar6 = ASDCP::MXF::ASDCP_MCAConfigParser::DecodeString
                          ((string *)pCVar14,(string *)local_98);
        this_01 = (CommandOptions *)local_f8._0_8_;
        if ((CommandOptions *)local_f8._0_8_ != (CommandOptions *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
        }
      }
      else {
        this_01 = local_c8;
        cVar6 = ASDCP::MXF::ASDCP_MCAConfigParser::DecodeString
                          ((string *)local_c8,(string *)local_98);
      }
      if (cVar6 == '\0') goto LAB_0010fb78;
    }
  }
  if ((this->help_flag == false) && (this->version_flag == false)) {
    if ((this->filenames).
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size < 2) {
      CommandOptions(this_01);
    }
    else {
      std::__cxx11::string::_M_assign(psVar19);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(local_b8,(this->filenames).
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node.super__List_node_base._M_prev);
      this->error_flag = false;
    }
  }
LAB_0010fb78:
  if (local_98 != (undefined1  [8])local_88) {
    operator_delete((void *)local_98,CONCAT71(local_88._1_7_,local_88[0]) + 1);
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), key_flag(false), key_id_flag(false), asset_id_flag(false),
    encrypt_header_flag(true), write_hmac(true),
    verbose_flag(false), fb_dump_size(0),
    no_write_flag(false), version_flag(false), help_flag(false), stereo_image_flag(false),
    write_partial_pcm_flag(false), start_frame(0),
    duration(0xffffffff), use_smpte_labels(false), j2c_pedantic(true),
    fb_size(FRAME_BUFFER_SIZE),
    channel_fmt(PCM::CF_NONE),
    ffoa(0), max_channel_count(10), max_object_count(118), // hard-coded sample atmos properties
    dolby_atmos_sync_flag(false),
    show_ul_values_flag(false),
    mca_config(g_dict),
    use_interop_sound_wtf(false)
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);
    std::string mca_config_str;

    for ( int i = 1; i < argc; i++ )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '3': stereo_image_flag = true; break;

	      case 'A':
		TEST_EXTRA_ARG(i, 'A');
		if ( ! aux_data_coding.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'a':
		asset_id_flag = true;
		TEST_EXTRA_ARG(i, 'a');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], asset_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected asset ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));

		if ( verbose_flag )
		  fprintf(stderr, "Frame Buffer size: %u bytes.\n", fb_size);

		break;

	      case 'C':
		TEST_EXTRA_ARG(i, 'C');
		if ( ! channel_assignment.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'E': encrypt_header_flag = false; break;
	      case 'e': encrypt_header_flag = true; break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'g':
		TEST_EXTRA_ARG(i, 'g');
		mca_language = argv[i];
		break;

	      case 'h': help_flag = true; break;

	      case 'j': key_id_flag = true;
		TEST_EXTRA_ARG(i, 'j');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected key ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'k': key_flag = true;
		TEST_EXTRA_ARG(i, 'k');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_value, KeyLen, &length);

		  if ( length != KeyLen )
		    {
		      fprintf(stderr, "Unexpected key length: %u, expecting %u characters.\n", length, KeyLen);
		      return;
		    }
		}
		break;

	      case 'l':
		TEST_EXTRA_ARG(i, 'l');
		channel_fmt = decode_channel_fmt(argv[i]);
		break;

	      case 'L': use_smpte_labels = true; break;
	      case 'M': write_hmac = false; break;

	      case 'm':
		TEST_EXTRA_ARG_ALLOW_DASH(i, 'm');
		mca_config_str = argv[i];
		break;

	      case 'P':
		TEST_EXTRA_ARG(i, 'P');
		if ( ! picture_coding.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'Q': transfer_characteristic.Set(g_dict->ul(MDD_TransferCharacteristic_SMPTEST2084)); break;

	      case 's': dolby_atmos_sync_flag = true; break;

	      case 'T':
		TEST_EXTRA_ARG(i, 'T');
		if ( ! transfer_characteristic.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'u': show_ul_values_flag = true; break;
	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'w': use_interop_sound_wtf = true; break;
	      case 'W': no_write_flag = true; break;
	      case 'x': write_partial_pcm_flag = true; break;
	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {

	    if ( argv[i][0] != '-' )
	      {
		filenames.push_back(argv[i]);
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( ! mca_config_str.empty() )
      {
	if ( mca_language.empty() )
	  {
	    if ( ! mca_config.DecodeString(mca_config_str) )
	      {
		return;
	      }
	  }
	else
	  {
	    if ( ! mca_config.DecodeString(mca_config_str, mca_language) )
	      {
		return;
	      }
	  }
      }
		
    if ( help_flag || version_flag )
      {
	return;
      }

    if ( filenames.size() < 2 )
      {
	fputs("Option requires at least two filename arguments: <input-file> <output-file>\n", stderr);
	return;
      }

    out_file = filenames.back();
    filenames.pop_back();
    error_flag = false;
  }